

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlStreamPushInternal(xmlStreamCtxtPtr stream,xmlChar *name,xmlChar *ns,int nodeType)

{
  xmlStreamCompPtr pxVar1;
  xmlStreamStepPtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  xmlStreamCtxtPtr comp;
  int iVar11;
  bool bVar12;
  uint local_70;
  
  if ((stream == (xmlStreamCtxtPtr)0x0) || (stream->nbState < 0)) {
    return -1;
  }
  local_70 = 0;
  comp = stream;
  uVar10 = 0;
LAB_00171826:
  do {
    pxVar1 = stream->comp;
    if (ns == (xmlChar *)0x0 && (name == (xmlChar *)0x0 && nodeType == 1)) {
      comp->nbState = 0;
      comp->level = 0;
      comp->blockLevel = -1;
      uVar5 = uVar10;
      if ((pxVar1->flags & 0x8000) != 0) {
        uVar5 = 1;
        if ((pxVar1->nbStep != 0) &&
           ((((pxVar1->nbStep != 1 || (pxVar1->steps->nodeType != 100)) ||
             ((pxVar1->steps->flags & 1) == 0)) &&
            ((uVar5 = uVar10, (pxVar1->steps->flags & 4) != 0 &&
             (iVar8 = xmlStreamCtxtAddState(comp,0,0), iVar8 < 0)))))) {
          return -1;
        }
      }
      stream = comp->next;
    }
    else {
      if (pxVar1->nbStep == 0) {
        if ((stream->flags & 1U) != 0) {
          stream = stream->next;
          if (stream == (_xmlStreamCtxt *)0x0) {
            return uVar10;
          }
          goto LAB_00171826;
        }
        if ((nodeType != 2) && (((stream->flags & 6U) == 0 || (stream->level == 0)))) {
          uVar10 = 1;
        }
LAB_00171b84:
        stream->level = stream->level + 1;
      }
      else {
        if ((stream->blockLevel != -1) ||
           ((nodeType - 3U < 0xfffffffe && ((pxVar1->flags & 0x4000) == 0)))) goto LAB_00171b84;
        iVar8 = stream->nbState;
        if (0 < iVar8) {
          iVar11 = 0;
          do {
            if (((uint)pxVar1->flags >> 0x10 & 1) == 0) {
              if (stream->states[stream->nbState * 2 + -1] < stream->level) {
                return -1;
              }
              iVar7 = stream->states[stream->nbState * 2 + -2];
              iVar11 = iVar8;
LAB_00171920:
              pxVar2 = pxVar1->steps;
              uVar5 = pxVar2[iVar7].flags;
              iVar6 = pxVar2[iVar7].nodeType;
              if (iVar6 == nodeType) {
                if (iVar6 == 100) {
LAB_00171a62:
                  bVar12 = false;
                }
                else {
                  pxVar3 = pxVar2[iVar7].name;
                  pxVar4 = pxVar2[iVar7].ns;
                  if (pxVar3 == (xmlChar *)0x0) {
                    bVar12 = pxVar4 != (xmlChar *)0x0;
                    if ((ns != (xmlChar *)0x0) && (pxVar4 != (xmlChar *)0x0)) {
                      iVar6 = xmlStrEqual(pxVar4,ns);
                      bVar12 = iVar6 == 0;
                    }
                  }
                  else {
                    bVar12 = true;
                    if ((((name != (xmlChar *)0x0) &&
                         ((ns == (xmlChar *)0x0) != (pxVar4 != (xmlChar *)0x0))) &&
                        (*pxVar3 == *name)) &&
                       ((iVar6 = xmlStrEqual(pxVar3,name), iVar6 != 0 &&
                        ((pxVar4 == ns || (iVar6 = xmlStrEqual(pxVar4,ns), iVar6 != 0))))))
                    goto LAB_00171a62;
                  }
                }
                if (!bVar12) {
                  local_70 = uVar5 & 2;
                  uVar9 = 1;
                  if ((local_70 == 0) &&
                     (iVar7 = xmlStreamCtxtAddState(stream,iVar7 + 1,stream->level + 1),
                     uVar9 = uVar10, iVar7 < 0)) {
                    return -1;
                  }
                  if (uVar9 == 1) {
                    uVar10 = 1;
                  }
                  else {
                    uVar10 = uVar5 >> 5 & 1;
                  }
                }
                if ((pxVar1->flags & 0x10000) == 0) {
                  if ((bool)(bVar12 | local_70 != 0)) goto LAB_00171b47;
                  local_70 = 0;
                }
              }
              else {
                if (iVar6 == 100) goto LAB_00171a62;
                if ((iVar6 != 2) || (((uint)pxVar1->flags >> 0x10 & 1) != 0)) goto LAB_00171b5e;
LAB_00171b47:
                stream->blockLevel = stream->level + 1;
              }
            }
            else {
              iVar7 = stream->states[(uint)(iVar11 * 2)];
              if (-1 < (long)iVar7) {
                iVar6 = stream->states[(ulong)(uint)(iVar11 * 2) + 1];
                if ((iVar6 <= stream->level) &&
                   ((stream->level <= iVar6 || ((pxVar1->steps[iVar7].flags & 1U) != 0))))
                goto LAB_00171920;
              }
            }
LAB_00171b5e:
            iVar11 = iVar11 + 1;
          } while (iVar11 < iVar8);
        }
        iVar8 = stream->level;
        iVar11 = iVar8 + 1;
        stream->level = iVar11;
        pxVar2 = pxVar1->steps;
        uVar5 = pxVar2->flags;
        if ((uVar5 & 4) != 0) goto LAB_00171b89;
        pxVar3 = pxVar2->name;
        pxVar4 = pxVar2->ns;
        iVar7 = pxVar2->nodeType;
        uVar9 = stream->flags;
        if ((uVar9 & 7) == 0) {
LAB_00171c44:
          if ((iVar7 == nodeType) || (nodeType != 2 && iVar7 == 100)) {
            if (iVar7 == 100) {
              bVar12 = false;
            }
            else if (pxVar3 == (xmlChar *)0x0) {
              bVar12 = pxVar4 != (xmlChar *)0x0;
              if ((ns != (xmlChar *)0x0) && (pxVar4 != (xmlChar *)0x0)) {
                iVar8 = xmlStrEqual(pxVar4,ns);
                bVar12 = iVar8 == 0;
              }
            }
            else {
              bVar12 = true;
              if ((((name != (xmlChar *)0x0) &&
                   ((ns == (xmlChar *)0x0) != (pxVar4 != (xmlChar *)0x0))) && (*pxVar3 == *name)) &&
                 ((iVar8 = xmlStrEqual(pxVar3,name), iVar8 != 0 &&
                  ((pxVar4 == ns || (iVar8 = xmlStrEqual(pxVar4,ns), iVar8 != 0)))))) {
                bVar12 = false;
              }
            }
            local_70 = uVar5 & 2;
            if (!bVar12) {
              uVar9 = 1;
              if ((local_70 == 0) &&
                 (iVar8 = xmlStreamCtxtAddState(stream,1,stream->level), uVar9 = uVar10, iVar8 < 0))
              {
                return -1;
              }
              uVar10 = 1;
              if (uVar9 != 1) {
                uVar10 = uVar5 >> 5 & 1;
              }
            }
            if ((pxVar1->flags & 0x10000) == 0) {
              if ((bool)(local_70 == 0 & (bVar12 ^ 1U))) {
                local_70 = 0;
              }
              else {
                stream->blockLevel = stream->level;
              }
            }
          }
        }
        else if (iVar8 == 0) {
          if ((uVar9 & 6) == 0) goto LAB_00171c44;
        }
        else if (((uVar5 & 1) != 0) || ((uVar9 & 6) != 0 && iVar11 == 2)) goto LAB_00171c44;
      }
LAB_00171b89:
      stream = stream->next;
      uVar5 = uVar10;
    }
    comp = stream;
    uVar10 = uVar5;
    if (stream == (_xmlStreamCtxt *)0x0) {
      return uVar5;
    }
  } while( true );
}

Assistant:

static int
xmlStreamPushInternal(xmlStreamCtxtPtr stream,
		      const xmlChar *name, const xmlChar *ns,
		      int nodeType) {
    int ret = 0, final = 0, tmp, i, m, match, stepNr, desc;
    xmlStreamCompPtr comp;
    xmlStreamStep step;

    if ((stream == NULL) || (stream->nbState < 0))
        return(-1);

    while (stream != NULL) {
	comp = stream->comp;

	if ((nodeType == XML_ELEMENT_NODE) &&
	    (name == NULL) && (ns == NULL)) {
	    /* We have a document node here (or a reset). */
	    stream->nbState = 0;
	    stream->level = 0;
	    stream->blockLevel = -1;
	    if (comp->flags & XML_STREAM_FROM_ROOT) {
		if (comp->nbStep == 0) {
		    /* TODO: We have a "/." here? */
		    ret = 1;
		} else {
		    if ((comp->nbStep == 1) &&
			(comp->steps[0].nodeType == XML_STREAM_ANY_NODE) &&
			(comp->steps[0].flags & XML_STREAM_STEP_DESC))
		    {
			/*
			* In the case of "//." the document node will match
			* as well.
			*/
			ret = 1;
		    } else if (comp->steps[0].flags & XML_STREAM_STEP_ROOT) {
			if (xmlStreamCtxtAddState(stream, 0, 0) < 0)
                            return(-1);
		    }
		}
	    }
	    stream = stream->next;
	    continue; /* while */
	}

	/*
	* Fast check for ".".
	*/
	if (comp->nbStep == 0) {
	    /*
	     * / and . are handled at the XPath node set creation
	     * level by checking min depth
	     */
	    if (stream->flags & XML_PATTERN_XPATH) {
		stream = stream->next;
		continue; /* while */
	    }
	    /*
	    * For non-pattern like evaluation like XML Schema IDCs
	    * or traditional XPath expressions, this will match if
	    * we are at the first level only, otherwise on every level.
	    */
	    if ((nodeType != XML_ATTRIBUTE_NODE) &&
		(((stream->flags & XML_PATTERN_NOTPATTERN) == 0) ||
		(stream->level == 0))) {
		    ret = 1;
	    }
	    stream->level++;
	    goto stream_next;
	}
	if (stream->blockLevel != -1) {
	    /*
	    * Skip blocked expressions.
	    */
	    stream->level++;
	    goto stream_next;
	}

	if ((nodeType != XML_ELEMENT_NODE) &&
	    (nodeType != XML_ATTRIBUTE_NODE) &&
	    ((comp->flags & XML_STREAM_FINAL_IS_ANY_NODE) == 0)) {
	    /*
	    * No need to process nodes of other types if we don't
	    * resolve to those types.
	    * TODO: Do we need to block the context here?
	    */
	    stream->level++;
	    goto stream_next;
	}

	/*
	 * Check evolution of existing states
	 */
	i = 0;
	m = stream->nbState;
	while (i < m) {
	    if ((comp->flags & XML_STREAM_DESC) == 0) {
		/*
		* If there is no "//", then only the last
		* added state is of interest.
		*/
		stepNr = stream->states[2 * (stream->nbState -1)];
		/*
		* TODO: Security check, should not happen, remove it.
		*/
		if (stream->states[(2 * (stream->nbState -1)) + 1] <
		    stream->level) {
		    return (-1);
		}
		desc = 0;
		/* loop-stopper */
		i = m;
	    } else {
		/*
		* If there are "//", then we need to process every "//"
		* occurring in the states, plus any other state for this
		* level.
		*/
		stepNr = stream->states[2 * i];

		/* TODO: should not happen anymore: dead states */
		if (stepNr < 0)
		    goto next_state;

		tmp = stream->states[(2 * i) + 1];

		/* skip new states just added */
		if (tmp > stream->level)
		    goto next_state;

		/* skip states at ancestor levels, except if "//" */
		desc = comp->steps[stepNr].flags & XML_STREAM_STEP_DESC;
		if ((tmp < stream->level) && (!desc))
		    goto next_state;
	    }
	    /*
	    * Check for correct node-type.
	    */
	    step = comp->steps[stepNr];
	    if (step.nodeType != nodeType) {
		if (step.nodeType == XML_ATTRIBUTE_NODE) {
		    /*
		    * Block this expression for deeper evaluation.
		    */
		    if ((comp->flags & XML_STREAM_DESC) == 0)
			stream->blockLevel = stream->level +1;
		    goto next_state;
		} else if (step.nodeType != XML_STREAM_ANY_NODE)
		    goto next_state;
	    }
	    /*
	    * Compare local/namespace-name.
	    */
	    match = 0;
	    if (step.nodeType == XML_STREAM_ANY_NODE) {
		match = 1;
	    } else if (step.name == NULL) {
		if (step.ns == NULL) {
		    /*
		    * This lets through all elements/attributes.
		    */
		    match = 1;
		} else if (ns != NULL)
		    match = xmlStrEqual(step.ns, ns);
	    } else if (((step.ns != NULL) == (ns != NULL)) &&
		(name != NULL) &&
		(step.name[0] == name[0]) &&
		xmlStrEqual(step.name, name) &&
		((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	    {
		match = 1;
	    }
	    if (match) {
		final = step.flags & XML_STREAM_STEP_FINAL;
                if (final) {
                    ret = 1;
                } else if (xmlStreamCtxtAddState(stream, stepNr + 1,
                                                 stream->level + 1) < 0) {
                    return(-1);
                }
		if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		    /*
		    * Check if we have a special case like "foo/bar//.", where
		    * "foo" is selected as well.
		    */
		    ret = 1;
		}
	    }
	    if (((comp->flags & XML_STREAM_DESC) == 0) &&
		((! match) || final))  {
		/*
		* Mark this expression as blocked for any evaluation at
		* deeper levels. Note that this includes "/foo"
		* expressions if the *pattern* behaviour is used.
		*/
		stream->blockLevel = stream->level +1;
	    }
next_state:
	    i++;
	}

	stream->level++;

	/*
	* Re/enter the expression.
	* Don't reenter if it's an absolute expression like "/foo",
	*   except "//foo".
	*/
	step = comp->steps[0];
	if (step.flags & XML_STREAM_STEP_ROOT)
	    goto stream_next;

	desc = step.flags & XML_STREAM_STEP_DESC;
	if (stream->flags & XML_PATTERN_NOTPATTERN) {
	    /*
	    * Re/enter the expression if it is a "descendant" one,
	    * or if we are at the 1st level of evaluation.
	    */

	    if (stream->level == 1) {
		if (XML_STREAM_XS_IDC(stream)) {
		    /*
		    * XS-IDC: The missing "self::node()" will always
		    * match the first given node.
		    */
		    goto stream_next;
		} else
		    goto compare;
	    }
	    /*
	    * A "//" is always reentrant.
	    */
	    if (desc)
		goto compare;

	    /*
	    * XS-IDC: Process the 2nd level, since the missing
	    * "self::node()" is responsible for the 2nd level being
	    * the real start level.
	    */
	    if ((stream->level == 2) && XML_STREAM_XS_IDC(stream))
		goto compare;

	    goto stream_next;
	}

compare:
	/*
	* Check expected node-type.
	*/
	if (step.nodeType != nodeType) {
	    if (nodeType == XML_ATTRIBUTE_NODE)
		goto stream_next;
	    else if (step.nodeType != XML_STREAM_ANY_NODE)
		goto stream_next;
	}
	/*
	* Compare local/namespace-name.
	*/
	match = 0;
	if (step.nodeType == XML_STREAM_ANY_NODE) {
	    match = 1;
	} else if (step.name == NULL) {
	    if (step.ns == NULL) {
		/*
		* This lets through all elements/attributes.
		*/
		match = 1;
	    } else if (ns != NULL)
		match = xmlStrEqual(step.ns, ns);
	} else if (((step.ns != NULL) == (ns != NULL)) &&
	    (name != NULL) &&
	    (step.name[0] == name[0]) &&
	    xmlStrEqual(step.name, name) &&
	    ((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	{
	    match = 1;
	}
	final = step.flags & XML_STREAM_STEP_FINAL;
	if (match) {
	    if (final) {
		ret = 1;
            } else if (xmlStreamCtxtAddState(stream, 1, stream->level) < 0) {
                return(-1);
            }
	    if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		/*
		* Check if we have a special case like "foo//.", where
		* "foo" is selected as well.
		*/
		ret = 1;
	    }
	}
	if (((comp->flags & XML_STREAM_DESC) == 0) &&
	    ((! match) || final))  {
	    /*
	    * Mark this expression as blocked for any evaluation at
	    * deeper levels.
	    */
	    stream->blockLevel = stream->level;
	}

stream_next:
        stream = stream->next;
    } /* while stream != NULL */

    return(ret);
}